

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall NetworkNS::Domain::Domain(Domain *this,string *filename)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  istream *piVar4;
  double dVar5;
  int local_434;
  undefined1 local_430 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  stringstream ss;
  ostream local_408 [376];
  undefined1 local_290 [8];
  string buf;
  undefined1 local_260 [8];
  string current_line;
  undefined1 local_238 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines_of_file;
  ifstream data_file;
  string *filename_local;
  Domain *this_local;
  
  this->_vptr_Domain = (_func_int **)&PTR__Domain_00125d00;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream
            (&lines_of_file.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar2,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_238);
  for (current_line.field_2._12_4_ = 0; (int)current_line.field_2._12_4_ < 0xb;
      current_line.field_2._12_4_ = current_line.field_2._12_4_ + 1) {
    std::__cxx11::string::string((string *)local_260);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)
               &lines_of_file.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_260);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_238,(value_type *)local_260);
    std::__cxx11::string::~string((string *)local_260);
  }
  std::__cxx11::string::string((string *)local_290);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_430);
  for (local_434 = 0; local_434 < 3; local_434 = local_434 + 1) {
    std::ostream::flush();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_430);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_238,(long)(local_434 + 8));
    std::operator<<(local_408,(string *)pvVar3);
    while( true ) {
      piVar4 = std::operator>>((istream *)
                               &tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)local_290);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar1) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_430,(value_type *)local_290);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_430,0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    dVar5 = atof(pcVar2);
    this->BoxLow[local_434] = dVar5;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_430,1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    dVar5 = atof(pcVar2);
    this->BoxHigh[local_434] = dVar5;
  }
  this->XBoxLen = this->BoxHigh[0] - this->BoxLow[0];
  this->iXBoxLen = 1.0 / this->XBoxLen;
  this->YBoxLen = this->BoxHigh[1] - this->BoxLow[1];
  this->iYBoxLen = 1.0 / this->YBoxLen;
  this->ZBoxLen = this->BoxHigh[2] - this->BoxLow[2];
  this->iZBoxLen = 1.0 / this->ZBoxLen;
  this->BoxExists = 1;
  this->NonPeriodic = 0;
  this->Zperiodic = 1;
  this->Yperiodic = 1;
  this->Xperiodic = 1;
  this->Periodicity[0] = this->Xperiodic;
  this->Periodicity[1] = this->Yperiodic;
  this->Periodicity[2] = this->Zperiodic;
  this->Boundary[0][1] = 0;
  this->Boundary[0][0] = 0;
  this->Boundary[1][1] = 0;
  this->Boundary[1][0] = 0;
  this->Boundary[2][1] = 0;
  this->Boundary[2][0] = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_430);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
  std::ifstream::~ifstream
            (&lines_of_file.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

Domain::Domain(std::string filename) {

      ifstream data_file(filename.c_str(), ifstream::in);
      /* Define an array of strings to hold the contents of the file. */
      std::vector <string> lines_of_file;

      for (int i = 0; i < 11; i++) {
         /* A temporary string for the current line of the file. */
         std::string current_line;
         getline(data_file, current_line);
         /* Add current line to file's array of lines. */
         lines_of_file.push_back(current_line);
      }

      /* x box dimension is stored in the 9th line: */
      string buf;
      stringstream ss;
      vector<string> tokens;

      // http://www.cplusplus.com/faq/sequences/strings/split/#boost-split

      for (int i = 0; i < 3; i++) {
         ss.flush();
         tokens.clear();
         ss << lines_of_file[8 + i];
         while (ss >> buf)
            tokens.push_back(buf);
         BoxLow[i] = atof(tokens[0].c_str());
         BoxHigh[i] = atof(tokens[1].c_str());
      }


      XBoxLen = BoxHigh[0] - BoxLow[0];
      iXBoxLen = 1.0 / XBoxLen;

      YBoxLen = BoxHigh[1] - BoxLow[1];
      iYBoxLen = 1.0 / YBoxLen;

      ZBoxLen = BoxHigh[2] - BoxLow[2];
      iZBoxLen = 1.0 / ZBoxLen;

      BoxExists = 1;
      NonPeriodic = 0;
      Xperiodic = Yperiodic = Zperiodic = 1;
      Periodicity[0] = Xperiodic;
      Periodicity[1] = Yperiodic;
      Periodicity[2] = Zperiodic;

      Boundary[0][0] = Boundary[0][1] = 0;
      Boundary[1][0] = Boundary[1][1] = 0;
      Boundary[2][0] = Boundary[2][1] = 0;

      return;
   }